

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

QByteArray * __thiscall QTlsPrivate::TlsKey::pemFooter(TlsKey *this)

{
  int iVar1;
  long *in_RSI;
  DataPointer *in_RDI;
  long in_FS_OFFSET;
  DataPointer *this_00;
  QArrayDataPointer<char> local_80;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_50;
  QArrayDataPointer<char> local_38;
  QArrayDataPointer<char> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  iVar1 = (**(code **)(*in_RSI + 0x50))();
  if (iVar1 == 1) {
    QArrayDataPointer<char>::QArrayDataPointer
              (&local_20,(Data *)0x0,"-----END PUBLIC KEY-----",0x18);
    QByteArray::QByteArray((QByteArray *)this_00,in_RDI);
    QArrayDataPointer<char>::~QArrayDataPointer(this_00);
  }
  else {
    iVar1 = (**(code **)(*in_RSI + 0x58))();
    if (iVar1 == 1) {
      QArrayDataPointer<char>::QArrayDataPointer
                (&local_38,(Data *)0x0,"-----END RSA PRIVATE KEY-----",0x1d);
      QByteArray::QByteArray((QByteArray *)this_00,in_RDI);
      QArrayDataPointer<char>::~QArrayDataPointer(this_00);
    }
    else {
      iVar1 = (**(code **)(*in_RSI + 0x58))();
      if (iVar1 == 2) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (&local_50,(Data *)0x0,"-----END DSA PRIVATE KEY-----",0x1d);
        QByteArray::QByteArray((QByteArray *)this_00,in_RDI);
        QArrayDataPointer<char>::~QArrayDataPointer(this_00);
      }
      else {
        iVar1 = (**(code **)(*in_RSI + 0x58))();
        if (iVar1 == 3) {
          QArrayDataPointer<char>::QArrayDataPointer
                    (&local_68,(Data *)0x0,"-----END EC PRIVATE KEY-----",0x1c);
          QByteArray::QByteArray((QByteArray *)this_00,in_RDI);
          QArrayDataPointer<char>::~QArrayDataPointer(this_00);
        }
        else {
          iVar1 = (**(code **)(*in_RSI + 0x58))();
          if (iVar1 == 4) {
            QArrayDataPointer<char>::QArrayDataPointer
                      (&local_80,(Data *)0x0,"-----END PRIVATE KEY-----",0x19);
            QByteArray::QByteArray((QByteArray *)this_00,in_RDI);
            QArrayDataPointer<char>::~QArrayDataPointer(this_00);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)this_00;
}

Assistant:

QByteArray TlsKey::pemFooter() const
{
    if (type() == QSsl::PublicKey)
        return QByteArrayLiteral("-----END PUBLIC KEY-----");
    else if (algorithm() == QSsl::Rsa)
        return QByteArrayLiteral("-----END RSA PRIVATE KEY-----");
    else if (algorithm() == QSsl::Dsa)
        return QByteArrayLiteral("-----END DSA PRIVATE KEY-----");
    else if (algorithm() == QSsl::Ec)
        return QByteArrayLiteral("-----END EC PRIVATE KEY-----");
    else if (algorithm() == QSsl::Dh)
        return QByteArrayLiteral("-----END PRIVATE KEY-----");

    Q_UNREACHABLE_RETURN({});
}